

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_matcher.hpp
# Opt level: O0

string_t * __thiscall
PathMatcher<int>::get_wildcard_value
          (string_t *__return_storage_ptr__,PathMatcher<int> *this,string_t *path,size_t *pos)

{
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  int begin;
  size_t *pos_local;
  string_t *path_local;
  PathMatcher<int> *this_local;
  
  while( true ) {
    uVar1 = *pos;
    lVar2 = std::__cxx11::string::size();
    if (lVar2 - 1U <= uVar1) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
      return __return_storage_ptr__;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)path);
    if (*pcVar3 == this->trailing_wildcard_) break;
    *pos = *pos + 1;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
  return __return_storage_ptr__;
}

Assistant:

string_t get_wildcard_value(string_t &path, size_t &pos) {
        // Walks down the input until the trailing_wildcard_ is found or the end is reached, everything between equals the wildcard value
        int begin = pos;
        for (; pos < path.size() - 1; pos++) {
            if (path[pos + 1] == trailing_wildcard_) {
                return path.substr(begin, pos - begin + 1);
            }
        }
        return path.substr(begin);
    }